

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O2

void __thiscall
Js::SourceDynamicProfileManager::EnsureStartupFunctions
          (SourceDynamicProfileManager *this,uint numberOfFunctions)

{
  Type *this_00;
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  BVFixed *ptr;
  BVFixed *pBVar5;
  
  if (numberOfFunctions == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceDynamicProfileManager.cpp"
                                ,0x45,"(numberOfFunctions != 0)","numberOfFunctions != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  this_00 = &this->startupFunctions;
  pBVar5 = (this->startupFunctions).ptr;
  if (pBVar5 == (BVFixed *)0x0) {
    pBVar5 = (BVFixed *)0x0;
  }
  else {
    BVar3 = BVFixed::Length(pBVar5);
    if (numberOfFunctions <= BVar3) {
      return;
    }
    pBVar5 = this_00->ptr;
  }
  ptr = BVFixed::New<Memory::Recycler>(numberOfFunctions,this->recycler,false);
  Memory::WriteBarrierPtr<BVFixed>::WriteBarrierSet(this_00,ptr);
  if (pBVar5 == (BVFixed *)0x0) {
    return;
  }
  BVFixed::Copy(this_00->ptr,pBVar5);
  return;
}

Assistant:

void SourceDynamicProfileManager::EnsureStartupFunctions(uint numberOfFunctions)
    {
        Assert(numberOfFunctions != 0);
        if(!startupFunctions || numberOfFunctions > startupFunctions->Length())
        {
            BVFixed* oldStartupFunctions = this->startupFunctions;
            startupFunctions = BVFixed::New(numberOfFunctions, this->GetRecycler());
            if(oldStartupFunctions)
            {
                this->startupFunctions->Copy(oldStartupFunctions);
            }
        }
    }